

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser.cc
# Opt level: O0

string * CLParser::FilterShowIncludes
                   (string *__return_storage_ptr__,string *line,string *deps_prefix)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  void *__s2;
  string *local_a0;
  allocator<char> local_75;
  undefined4 local_74;
  string *local_70;
  string *prefix;
  char *end;
  char *in;
  allocator<char> local_41;
  string local_40 [8];
  string kDepsPrefixEnglish;
  string *deps_prefix_local;
  string *line_local;
  
  kDepsPrefixEnglish.field_2._8_8_ = deps_prefix;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Note: including file: ",&local_41);
  std::allocator<char>::~allocator(&local_41);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  end = pcVar2;
  lVar3 = std::__cxx11::string::size();
  prefix = (string *)(pcVar2 + lVar3);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    local_a0 = (string *)kDepsPrefixEnglish.field_2._8_8_;
  }
  else {
    local_a0 = local_40;
  }
  local_70 = local_a0;
  lVar3 = (long)prefix - (long)end;
  iVar1 = std::__cxx11::string::size();
  pcVar2 = end;
  if (iVar1 < lVar3) {
    __s2 = (void *)std::__cxx11::string::c_str();
    iVar1 = std::__cxx11::string::size();
    iVar1 = memcmp(pcVar2,__s2,(long)iVar1);
    if (iVar1 == 0) {
      lVar3 = std::__cxx11::string::size();
      for (end = end + lVar3; *end == ' '; end = end + 1) {
      }
      std::__cxx11::string::c_str();
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)line);
      goto LAB_0012794b;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",&local_75);
  std::allocator<char>::~allocator(&local_75);
LAB_0012794b:
  local_74 = 1;
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

string CLParser::FilterShowIncludes(const string& line,
                                    const string& deps_prefix) {
  const string kDepsPrefixEnglish = "Note: including file: ";
  const char* in = line.c_str();
  const char* end = in + line.size();
  const string& prefix = deps_prefix.empty() ? kDepsPrefixEnglish : deps_prefix;
  if (end - in > (int)prefix.size() &&
      memcmp(in, prefix.c_str(), (int)prefix.size()) == 0) {
    in += prefix.size();
    while (*in == ' ')
      ++in;
    return line.substr(in - line.c_str());
  }
  return "";
}